

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.cpp
# Opt level: O0

void __thiscall so_5::environment_params_t::~environment_params_t(environment_params_t *this)

{
  environment_params_t *this_local;
  
  std::
  function<std::unique_ptr<so_5::environment_infrastructure_t,_void_(*)(so_5::environment_infrastructure_t_*)>_(so_5::environment_t_&,_so_5::environment_params_t_&,_so_5::intrusive_ptr_t<so_5::abstract_message_box_t>)>
  ::~function(&this->m_infrastructure_factory);
  std::
  unique_ptr<so_5::queue_locks_defaults_manager_t,_std::default_delete<so_5::queue_locks_defaults_manager_t>_>
  ::~unique_ptr(&this->m_queue_locks_defaults_manager);
  so_5::disp::one_thread::disp_params_t::~disp_params_t(&this->m_default_disp_params);
  std::unique_ptr<so_5::msg_tracing::tracer_t,_std::default_delete<so_5::msg_tracing::tracer_t>_>::
  ~unique_ptr(&this->m_message_delivery_tracer);
  std::shared_ptr<so_5::error_logger_t>::~shared_ptr(&this->m_error_logger);
  std::
  unique_ptr<so_5::event_exception_logger_t,_std::default_delete<so_5::event_exception_logger_t>_>::
  ~unique_ptr(&this->m_event_exception_logger);
  std::unique_ptr<so_5::coop_listener_t,_std::default_delete<so_5::coop_listener_t>_>::~unique_ptr
            (&this->m_coop_listener);
  std::
  map<std::type_index,_std::shared_ptr<so_5::layer_t>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<so_5::layer_t>_>_>_>
  ::~map(&this->m_so_layers);
  std::
  function<std::unique_ptr<so_5::timer_thread_t,_std::default_delete<so_5::timer_thread_t>_>_(std::shared_ptr<so_5::error_logger_t>)>
  ::~function(&this->m_timer_thread_factory);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>_>_>
  ::~map(&this->m_named_dispatcher_map);
  return;
}

Assistant:

environment_params_t::~environment_params_t()
{
}